

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Compressed2DFormatCase::init
          (Compressed2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  int extraout_EAX;
  Texture2D *this_00;
  uint uVar2;
  ulong uVar3;
  Random rnd;
  CompressedTexture compressedTexture;
  TexDecompressionParams local_64;
  deRandom local_60;
  CompressedTexture local_50;
  
  tcu::CompressedTexture::CompressedTexture(&local_50,this->m_format,this->m_width,this->m_height,1)
  ;
  deRandom_init(&local_60,this->m_randomSeed);
  uVar2 = (int)local_50.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
          (int)local_50.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      dVar1 = deRandom_getUint32(&local_60);
      local_50.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (uchar)dVar1;
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
  }
  this_00 = (Texture2D *)operator_new(0x70);
  local_64.astcMode = ASTCMODE_LAST;
  glu::Texture2D::Texture2D(this_00,this->m_renderCtx,this->m_renderCtxInfo,1,&local_50,&local_64);
  this->m_texture = this_00;
  tcu::CompressedTexture::~CompressedTexture(&local_50);
  return extraout_EAX;
}

Assistant:

void Compressed2DFormatCase::init (void)
{
	// Create texture.
	tcu::CompressedTexture	compressedTexture	(m_format, m_width, m_height);
	int						dataSize			= compressedTexture.getDataSize();
	deUint8*				data				= (deUint8*)compressedTexture.getData();
	de::Random				rnd					(m_randomSeed);

	for (int i = 0; i < dataSize; i++)
		data[i] = rnd.getUint32() & 0xff;

	m_texture = new glu::Texture2D(m_renderCtx, m_renderCtxInfo, 1, &compressedTexture);
}